

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O3

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Option *this_00;
  size_t __n;
  pointer pbVar3;
  size_type sVar4;
  App *subcom;
  App *pAVar5;
  size_type sVar6;
  string *psVar7;
  byte bVar8;
  int iVar9;
  ostream *poVar10;
  App *pAVar11;
  long *plVar12;
  undefined7 in_register_00000009;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  pointer __rhs;
  pointer pbVar16;
  _Alloc_hider _Var17;
  pointer ppOVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  byte bVar22;
  pointer ppOVar23;
  bool bVar24;
  string name;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string commentLead;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  _Any_data local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  byte local_345;
  uint local_344;
  string local_340;
  App *local_320;
  string local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  undefined8 local_2f0;
  string local_2e8;
  string *local_2c8;
  ConfigBase *local_2c0;
  string local_2b8;
  long *local_298;
  long local_290;
  long local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  size_type *local_248 [2];
  size_type local_238 [2];
  string local_228;
  string *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_2f8._4_4_,(int)CONCAT71(in_register_00000081,write_description));
  local_344 = (uint)CONCAT71(in_register_00000009,default_also);
  local_320 = app;
  local_2c8 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_local_buf[0] = '\0';
  local_2c0 = this;
  ::std::__cxx11::string::push_back((char)&local_2e8);
  ::std::__cxx11::string::push_back((char)&local_2e8);
  local_208 = __return_storage_ptr__;
  App::get_groups_abi_cxx11_(&local_260,local_320);
  pbVar16 = local_260.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_368._M_unused._M_object = &local_358;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Options","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_260,(const_iterator)pbVar16,(value_type *)&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_unused._0_8_ != &local_358) {
    operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
  }
  if ((byte)local_2f8 != '\0') {
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
    pcVar2 = (local_320->description_)._M_dataplus._M_p;
    local_368._M_unused._M_object = &local_358;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,pcVar2,pcVar2 + (local_320->description_)._M_string_length);
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_368._M_unused._0_8_,local_368._8_8_);
    local_340._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_340,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_unused._0_8_ != &local_358) {
      operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
    }
  }
  if (local_260.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_260.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_200 = local_260.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar16 = local_260.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar21 = local_260.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar22 = 0;
    do {
      iVar9 = ::std::__cxx11::string::compare((char *)pbVar16);
      if (iVar9 == 0) {
        bVar8 = 1;
        if ((bVar22 & 1) == 0) goto LAB_0011372b;
      }
      else {
        bVar24 = pbVar16->_M_string_length == 0;
        bVar8 = 1;
        if ((bVar24 & bVar22) == 0) {
          bVar8 = bVar24 | bVar22;
LAB_0011372b:
          if ((((byte)local_2f8 != '\0') &&
              (iVar9 = ::std::__cxx11::string::compare((char *)pbVar16), iVar9 != 0)) &&
             (pbVar16->_M_string_length != 0)) {
            local_368._M_pod_data[0] = 10;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,local_368._M_pod_data,1);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(pbVar16->_M_dataplus)._M_p,pbVar16->_M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," Options\n",9);
          }
          local_1f8._M_unused._M_object = (void *)0x0;
          local_1f8._8_8_ = 0;
          local_1e8 = (code *)0x0;
          uStack_1e0 = 0;
          App::get_options(&local_278,local_320,(function<bool_(const_CLI::Option_*)> *)&local_1f8);
          local_345 = bVar8;
          if (local_1e8 != (code *)0x0) {
            (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
          }
          local_2f0 = local_278.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          ppOVar18 = local_278.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppOVar23 = local_278.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          if (local_278.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_278.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              this_00 = *ppOVar18;
              if (((this_00->super_OptionBase<CLI::Option>).configurable_ == true) &&
                 (((__n = (this_00->super_OptionBase<CLI::Option>).group_._M_string_length,
                   __n == pbVar16->_M_string_length &&
                   ((__n == 0 ||
                    (iVar9 = bcmp((this_00->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p,
                                  (pbVar16->_M_dataplus)._M_p,__n), iVar9 == 0)))) ||
                  ((iVar9 = ::std::__cxx11::string::compare((char *)pbVar16), iVar9 == 0 &&
                   ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
                __rhs = (this_00->lnames_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
                if (__rhs == (this_00->lnames_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish) {
                  if ((this_00->pname_)._M_string_length == 0) {
                    pbVar3 = (this_00->snames_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    __rhs = &this_00->envname_;
                    if (pbVar3 != (this_00->snames_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish) {
                      __rhs = pbVar3;
                    }
                  }
                  else {
                    __rhs = &this_00->pname_;
                  }
                }
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_368,local_2c8,__rhs);
                Option::reduced_results_abi_cxx11_((results_t *)&local_318,this_00);
                detail::ini_join(&local_340,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_318,local_2c0->arraySeparator,local_2c0->arrayStart,
                                 local_2c0->arrayEnd);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_318);
                if ((char)local_344 == '\x01' && (char *)local_340._M_string_length == (char *)0x0)
                {
                  pcVar2 = (this_00->default_str_)._M_dataplus._M_p;
                  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_318,pcVar2,
                             pcVar2 + (this_00->default_str_)._M_string_length);
                  sVar6 = local_318._M_string_length;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318._M_dataplus._M_p != &local_318.field_2) {
                    operator_delete(local_318._M_dataplus._M_p,
                                    local_318.field_2._M_allocated_capacity + 1);
                  }
                  if (sVar6 == 0) {
                    ppOVar23 = local_2f0;
                    if (this_00->expected_min_ == 0) {
                      ::std::__cxx11::string::_M_replace
                                ((ulong)&local_340,0,(char *)local_340._M_string_length,0x16f685);
                      ppOVar23 = local_2f0;
                    }
                  }
                  else {
                    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
                    pcVar2 = (this_00->default_str_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_2b8,pcVar2,
                               pcVar2 + (this_00->default_str_)._M_string_length);
                    detail::convert_arg_for_ini(&local_318,&local_2b8);
                    ::std::__cxx11::string::operator=((string *)&local_340,(string *)&local_318);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_318._M_dataplus._M_p != &local_318.field_2) {
                      operator_delete(local_318._M_dataplus._M_p,
                                      local_318.field_2._M_allocated_capacity + 1);
                    }
                    ppOVar23 = local_2f0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                      operator_delete(local_2b8._M_dataplus._M_p,
                                      local_2b8.field_2._M_allocated_capacity + 1);
                      ppOVar23 = local_2f0;
                    }
                  }
                }
                if ((char *)local_340._M_string_length != (char *)0x0) {
                  if (((byte)local_2f8 != '\0') && ((this_00->description_)._M_string_length != 0))
                  {
                    local_318._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_318,1);
                    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,local_2e8._M_dataplus._M_p,
                                         local_2e8._M_string_length);
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    pcVar2 = (this_00->description_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_228,pcVar2,
                               pcVar2 + (this_00->description_)._M_string_length);
                    detail::fix_newlines(&local_318,&local_2e8,&local_228);
                    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar10,local_318._M_dataplus._M_p,
                                         local_318._M_string_length);
                    local_2b8._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)&local_2b8,1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_318._M_dataplus._M_p != &local_318.field_2) {
                      operator_delete(local_318._M_dataplus._M_p,
                                      local_318.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228._M_dataplus._M_p != &local_228.field_2) {
                      operator_delete(local_228._M_dataplus._M_p,
                                      local_228.field_2._M_allocated_capacity + 1);
                    }
                  }
                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
                  local_318._M_dataplus._M_p._0_1_ = local_2c0->valueDelimiter;
                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,(char *)&local_318,1);
                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,local_340._M_dataplus._M_p,local_340._M_string_length
                                      );
                  local_318._M_dataplus._M_p._0_1_ = 10;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_318,1)
                  ;
                  ppOVar23 = local_2f0;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p,
                                  local_340.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_unused._0_8_ != &local_358) {
                  operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1)
                  ;
                }
              }
              ppOVar18 = ppOVar18 + 1;
            } while (ppOVar18 != ppOVar23);
          }
          pbVar21 = local_200;
          bVar8 = local_345;
          if (local_278.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.
                                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.
                                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            pbVar21 = local_200;
            bVar8 = local_345;
          }
        }
      }
      pbVar16 = pbVar16 + 1;
      bVar22 = bVar8;
    } while (pbVar16 != pbVar21);
  }
  local_358._M_allocated_capacity = 0;
  local_358._8_8_ = 0;
  local_368._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_368._8_8_ = 0;
  App::get_subcommands
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)&local_2b8,local_320,
             (function<bool_(const_CLI::App_*)> *)&local_368);
  if ((code *)local_358._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_358._M_allocated_capacity)(&local_368,&local_368,3);
  }
  sVar6 = local_2b8._M_string_length;
  if (local_2b8._M_dataplus._M_p != (pointer)local_2b8._M_string_length) {
    local_2f0 = (pointer)(CONCAT44(local_2f0._4_4_,local_344) & 0xffffffff000000ff);
    local_344 = (uint)(byte)local_2f8;
    _Var17._M_p = local_2b8._M_dataplus._M_p;
    do {
      sVar4 = *(size_type *)_Var17._M_p;
      if (*(long *)(sVar4 + 0x10) == 0) {
        if (((byte)local_2f8 != '\0') && (*(long *)(sVar4 + 0x2d8) != 0)) {
          local_368._M_pod_data[0] = 10;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,local_368._M_pod_data,1);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)(sVar4 + 0x2d0),*(long *)(sVar4 + 0x2d8));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," Options\n",9);
        }
        pcVar2 = (local_2c8->_M_dataplus)._M_p;
        local_1d8[0] = local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar2,pcVar2 + local_2c8->_M_string_length);
        (**(local_2c0->super_Config)._vptr_Config)
                  (&local_368,local_2c0,sVar4,(ulong)local_2f0 & 0xffffffff,(ulong)local_344,
                   (string *)local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_unused._0_8_ != &local_358) {
          operator_delete(local_368._M_unused._M_object,(ulong)(local_358._M_allocated_capacity + 1)
                         );
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
      }
      _Var17._M_p = _Var17._M_p + 8;
    } while (_Var17._M_p != (pointer)sVar6);
    local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_string_length;
    if (local_2b8._M_dataplus._M_p != (pointer)local_2b8._M_string_length) {
      paVar1 = &local_340.field_2;
      _Var17._M_p = local_2b8._M_dataplus._M_p;
      do {
        subcom = *(App **)_Var17._M_p;
        if ((subcom->name_)._M_string_length != 0) {
          if ((subcom->configurable_ == true) &&
             (pAVar11 = App::get_subcommand(local_320,subcom), pAVar11->parsed_ != 0)) {
            if ((local_2c8->_M_string_length == 0) && (local_320->parent_ != (App *)0x0)) {
              pcVar2 = (local_320->name_)._M_dataplus._M_p;
              local_340._M_dataplus._M_p = (pointer)paVar1;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_340,pcVar2,pcVar2 + (local_320->name_)._M_string_length);
              ::std::__cxx11::string::append((char *)&local_340);
              plVar12 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_340,
                                           (ulong)(subcom->name_)._M_dataplus._M_p);
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 == paVar14) {
                local_358._M_allocated_capacity = paVar14->_M_allocated_capacity;
                local_358._8_8_ = plVar12[3];
                local_368._M_unused._M_object = &local_358;
              }
              else {
                local_358._M_allocated_capacity = paVar14->_M_allocated_capacity;
                local_368._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar12;
              }
              local_368._8_8_ = plVar12[1];
              *plVar12 = (long)paVar14;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._M_dataplus._M_p != paVar1) {
                operator_delete(local_340._M_dataplus._M_p,
                                local_340.field_2._M_allocated_capacity + 1);
              }
              pAVar11 = local_320->parent_;
              pAVar5 = pAVar11->parent_;
              while (pAVar5 != (App *)0x0) {
                local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
                pcVar2 = (pAVar11->name_)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_318,pcVar2,pcVar2 + (pAVar11->name_)._M_string_length);
                ::std::__cxx11::string::append((char *)&local_318);
                plVar12 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_318,
                                             local_368._M_unused._M_member_pointer);
                psVar15 = (size_type *)(plVar12 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_340.field_2._M_allocated_capacity = *psVar15;
                  local_340.field_2._8_8_ = plVar12[3];
                  local_340._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_340.field_2._M_allocated_capacity = *psVar15;
                  local_340._M_dataplus._M_p = (pointer)*plVar12;
                }
                local_340._M_string_length = plVar12[1];
                *plVar12 = (long)psVar15;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                ::std::__cxx11::string::operator=
                          ((string *)local_368._M_pod_data,(string *)&local_340);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != paVar1) {
                  operator_delete(local_340._M_dataplus._M_p,
                                  local_340.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_dataplus._M_p != &local_318.field_2) {
                  operator_delete(local_318._M_dataplus._M_p,
                                  local_318.field_2._M_allocated_capacity + 1);
                }
                pAVar11 = pAVar11->parent_;
                pAVar5 = pAVar11->parent_;
              }
              local_340._M_dataplus._M_p._1_7_ =
                   (undefined7)((ulong)local_340._M_dataplus._M_p >> 8);
              local_340._M_dataplus._M_p._0_1_ = 0x5b;
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_340,1);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_368._M_unused._0_8_,local_368._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_unused._0_8_ != &local_358) {
                operator_delete(local_368._M_unused._M_object,
                                (ulong)(local_358._M_allocated_capacity + 1));
              }
            }
            else {
              local_368._M_pod_data[0] = 0x5b;
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,local_368._M_pod_data,1);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(local_2c8->_M_dataplus)._M_p,local_2c8->_M_string_length
                                  );
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(subcom->name_)._M_dataplus._M_p,
                                   (subcom->name_)._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]\n",2);
            }
            local_248[0] = local_238;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
            (**(local_2c0->super_Config)._vptr_Config)
                      (&local_368,local_2c0,subcom,(ulong)local_2f0 & 0xffffffff,(ulong)local_344,
                       (string *)local_248);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_unused._0_8_ != &local_358) {
              operator_delete(local_368._M_unused._M_object,
                              (ulong)(local_358._M_allocated_capacity + 1));
            }
            uVar19 = local_238[0];
            _Var20._M_p = (pointer)local_248[0];
            if (local_248[0] != local_238) {
LAB_00113fde:
              operator_delete(_Var20._M_p,uVar19 + 1);
            }
          }
          else {
            ::std::operator+(&local_340,local_2c8,&subcom->name_);
            plVar12 = (long *)::std::__cxx11::string::append((char *)&local_340);
            local_298 = &local_288;
            plVar13 = plVar12 + 2;
            if ((long *)*plVar12 == plVar13) {
              local_288 = *plVar13;
              uStack_280 = (undefined4)plVar12[3];
              uStack_27c = *(undefined4 *)((long)plVar12 + 0x1c);
            }
            else {
              local_288 = *plVar13;
              local_298 = (long *)*plVar12;
            }
            local_290 = plVar12[1];
            *plVar12 = (long)plVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            (**(local_2c0->super_Config)._vptr_Config)
                      (&local_368,local_2c0,subcom,(ulong)local_2f0 & 0xffffffff,(ulong)local_344,
                       &local_298);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_unused._0_8_ != &local_358) {
              operator_delete(local_368._M_unused._M_object,
                              (ulong)(local_358._M_allocated_capacity + 1));
            }
            if (local_298 != &local_288) {
              operator_delete(local_298,local_288 + 1);
            }
            uVar19 = local_340.field_2._M_allocated_capacity;
            _Var20._M_p = local_340._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != paVar1) goto LAB_00113fde;
          }
        }
        _Var17._M_p = _Var17._M_p + 8;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var17._M_p != local_2f8);
    }
  }
  psVar7 = local_208;
  ::std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    local_2b8.field_2._M_allocated_capacity - (long)local_2b8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                             local_2e8.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar7;
}

Assistant:

inline std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description) {
        out << commentLead << app->get_description() << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string name = prefix + opt->get_single_name();
                std::string value = detail::ini_join(opt->reduced_results(), arraySeparator, arrayStart, arrayEnd);

                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str());
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    }
                }

                if(!value.empty()) {
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(subcom->get_configurable() && app->got_subcommand(subcom)) {
                if(!prefix.empty() || app->get_parent() == nullptr) {
                    out << '[' << prefix << subcom->get_name() << "]\n";
                } else {
                    std::string subname = app->get_name() + "." + subcom->get_name();
                    auto p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        subname = p->get_name() + "." + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");
            }
        }
    }

    return out.str();
}